

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_db.c
# Opt level: O2

void nhdp_db_cleanup(void)

{
  list_entity *plVar1;
  list_entity *plVar2;
  
  plVar2 = _neigh_list.next;
  while (plVar2->prev != _neigh_list.prev) {
    plVar1 = plVar2->next;
    nhdp_db_neighbor_remove((nhdp_neighbor *)&plVar2[-10].prev);
    plVar2 = plVar1;
  }
  oonf_timer_remove(&_l2hop_vtime_info);
  oonf_timer_remove(&_link_symtime_info);
  oonf_timer_remove(&_link_heard_info);
  oonf_timer_remove(&_link_vtime_info);
  oonf_timer_remove(&_naddr_vtime_info);
  oonf_class_remove(&_l2hop_info);
  oonf_class_remove(&_laddr_info);
  oonf_class_remove(&_link_info);
  oonf_class_remove(&_naddr_info);
  oonf_class_remove(&_neigh_info);
  return;
}

Assistant:

void
nhdp_db_cleanup(void) {
  struct nhdp_neighbor *neigh, *n_it;

  /* remove all neighbors */
  list_for_each_element_safe(&_neigh_list, neigh, _global_node, n_it) {
    nhdp_db_neighbor_remove(neigh);
  }

  /* cleanup all timers */
  oonf_timer_remove(&_l2hop_vtime_info);
  oonf_timer_remove(&_link_symtime_info);
  oonf_timer_remove(&_link_heard_info);
  oonf_timer_remove(&_link_vtime_info);
  oonf_timer_remove(&_naddr_vtime_info);

  /* cleanup all memory cookies */
  oonf_class_remove(&_l2hop_info);
  oonf_class_remove(&_laddr_info);
  oonf_class_remove(&_link_info);
  oonf_class_remove(&_naddr_info);
  oonf_class_remove(&_neigh_info);
}